

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O3

void re2::Parse_Digits_NFA(int i)

{
  StringPiece local_18;
  
  BenchmarkMemoryUsage();
  local_18.ptr_ = "650-253-0001";
  local_18.length_ = 0xc;
  Parse3NFA(i,"([0-9]+)-([0-9]+)-([0-9]+)",&local_18);
  SetBenchmarkItemsProcessed(i);
  return;
}

Assistant:

void Parse_Digits_NFA(int i)         { Parse3Digits(i, Parse3NFA); }